

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# intersect_iterator.hpp
# Opt level: O1

void __thiscall
burst::
intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
::faze(intersect_iterator<__gnu_cxx::__normal_iterator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_*,_std::vector<boost::iterator_range<boost::range_detail::integer_iterator<int>_>,_std::allocator<boost::iterator_range<boost::range_detail::integer_iterator<int>_>_>_>_>,_std::less<void>_>
       *this)

{
  int iVar1;
  int iVar2;
  iterator_range<boost::range_detail::integer_iterator<int>_> *piVar3;
  iterator_range<boost::range_detail::integer_iterator<int>_> *piVar4;
  iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
  iVar5;
  iterator_range<boost::range_detail::integer_iterator<int>_> *piVar6;
  iterator_range<boost::range_detail::integer_iterator<int>_> *piVar7;
  
  piVar3 = (this->m_begin)._M_current;
  piVar4 = (this->m_end)._M_current;
  piVar7 = piVar3;
  piVar6 = piVar3;
  while( true ) {
    if (piVar4 == piVar7) {
      piVar3 = (this->m_end)._M_current;
      iVar5 = (piVar6->
              super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
              ).
              super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
              .
              super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      ;
      (piVar6->
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
      ).
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           = piVar3[-1].
             super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
             .
             super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
             .
             super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
      ;
      piVar3[-1].
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
      .
      super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
           = iVar5;
      return;
    }
    iVar1 = (piVar7->
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
            ).
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.m_value;
    iVar2 = iVar1 + 1;
    (piVar7->
    super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
    ).
    super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
    .
    super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
    .m_Begin.m_value = iVar2;
    if (iVar2 == (piVar7->
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                 ).
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.m_value) break;
    iVar2 = (piVar6->
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
            ).
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
            .
            super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
            .m_Begin.m_value;
    if (iVar2 == (piVar6->
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::random_access_traversal_tag>
                 ).
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::bidirectional_traversal_tag>
                 .
                 super_iterator_range_base<boost::range_detail::integer_iterator<int>,_boost::iterators::incrementable_traversal_tag>
                 .m_End.m_value) {
      __assert_fail("!empty()","/usr/include/boost/range/iterator_range_core.hpp",0xff,
                    "reference boost::iterator_range_detail::iterator_range_base<boost::range_detail::integer_iterator<int>, boost::iterators::incrementable_traversal_tag>::front() const [IteratorT = boost::range_detail::integer_iterator<int>, TraversalTag = boost::iterators::incrementable_traversal_tag]"
                   );
    }
    if (iVar2 <= iVar1) {
      piVar6 = piVar7;
    }
    piVar7 = piVar7 + 1;
  }
  (this->m_end)._M_current = piVar3;
  return;
}

Assistant:

void faze ()
        {
            auto max_range = m_begin;
            for (auto range = m_begin; range != m_end; ++range)
            {
                range->advance_begin(1);
                if (range->empty())
                {
                    scroll_to_end();
                    return;
                }
                else if (m_compare(max_range->front(), range->front()))
                {
                    max_range = range;
                }
            }
            std::iter_swap(max_range, std::prev(m_end));
        }